

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintPreformatted(cmDocumentationFormatter *this,ostream *os,char *text)

{
  char cVar1;
  byte bVar2;
  char *ptr;
  
  bVar2 = 1;
  for (; cVar1 = *text, cVar1 != '\0'; text = text + 1) {
    if (!(bool)(~bVar2 & 1 | cVar1 == '\n')) {
      std::operator<<(os,this->TextIndent);
      cVar1 = *text;
      bVar2 = 0;
    }
    std::operator<<(os,cVar1);
    bVar2 = bVar2 | *text == '\n';
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter::PrintPreformatted(std::ostream& os,
                                                     const char* text)
{
  bool newline = true;
  for(const char* ptr = text; *ptr; ++ptr)
    {
    if(newline && *ptr != '\n')
      {
      os << this->TextIndent;
      newline = false;
      }
    os << *ptr;
    if(*ptr == '\n')
      {
      newline = true;
      }
    }
  os << "\n";
}